

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Shaft::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Shaft *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Shaft *local_18;
  Shaft *this_local;
  
  local_18 = this;
  this_local = (Shaft *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Shaft:");
  poVar1 = std::operator<<(poVar1,"\n\tCurrent RPM:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16CurrentRPM);
  poVar1 = std::operator<<(poVar1,"\n\tOrdered RPM:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16OrderedRPM);
  poVar1 = std::operator<<(poVar1,"\n\tRate Of Change: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i32RPMRateOfChange);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Shaft::GetAsString() const
{
    KStringStream ss;

    ss << "Shaft:"
       << "\n\tCurrent RPM:    " << m_i16CurrentRPM
       << "\n\tOrdered RPM:    " << m_i16OrderedRPM
       << "\n\tRate Of Change: " << m_i32RPMRateOfChange
       << "\n";

    return ss.str();
}